

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O2

void Resmpl_EnsureBuffers(RESMPL_STATE *CAA,UINT32 length)

{
  DEV_SMPL *pDVar1;
  
  if (CAA->smplBufSize < length) {
    free(CAA->smplBufs[0]);
    CAA->smplBufSize = length;
    pDVar1 = (DEV_SMPL *)malloc((ulong)(length * 2) << 2);
    CAA->smplBufs[0] = pDVar1;
    if (pDVar1 == (DEV_SMPL *)0x0) {
      abort();
    }
    CAA->smplBufs[1] = pDVar1 + length;
  }
  return;
}

Assistant:

static void Resmpl_EnsureBuffers(RESMPL_STATE* CAA, UINT32 length)
{
	if (CAA->smplBufSize < length)
	{
		// We don't need the current buffer's contents,
		// so we can avoid calling realloc, which could copy the buffer's contents unnecessarily.
		free(CAA->smplBufs[0]);
		
		CAA->smplBufSize = length;
		CAA->smplBufs[0] = (DEV_SMPL*)malloc(CAA->smplBufSize * 2 * sizeof(DEV_SMPL));
		if (CAA->smplBufs[0] == NULL)
			abort();
		CAA->smplBufs[1] = &CAA->smplBufs[0][CAA->smplBufSize];
	}
}